

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

TYPE __thiscall
duckdb::RangeInfoStruct<duckdb::NumericRangeInfo,_true>::EndListValue
          (RangeInfoStruct<duckdb::NumericRangeInfo,_true> *this,idx_t row_idx)

{
  sel_t *psVar1;
  bool bVar2;
  
  bVar2 = (long)(this->args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start != 0x68;
  psVar1 = (this->vdata[bVar2].sel)->sel_vector;
  if (psVar1 != (sel_t *)0x0) {
    row_idx = (idx_t)psVar1[row_idx];
  }
  return *(TYPE *)(this->vdata[bVar2].data + row_idx * 8);
}

Assistant:

typename OP::TYPE EndListValue(idx_t row_idx) {
		idx_t vdata_idx = args.ColumnCount() == 1 ? 0 : 1;
		auto data = (typename OP::TYPE *)vdata[vdata_idx].data;
		auto idx = vdata[vdata_idx].sel->get_index(row_idx);
		return data[idx];
	}